

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O0

void EBPLM::PredictVelOnXFace
               (Box *xebox,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  Box *in_RDI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  Geometry *in_stack_00000030;
  undefined8 in_stack_00000040;
  bool has_extdir_or_ho_hi_z;
  bool has_extdir_or_ho_lo_z;
  pair<bool,_bool> extdir_lohi_z;
  int domain_khi;
  int domain_klo;
  bool has_extdir_or_ho_hi_y;
  bool has_extdir_or_ho_lo_y;
  bool has_extdir_or_ho_hi_x;
  bool has_extdir_or_ho_lo_x;
  pair<bool,_bool> extdir_lohi_y;
  pair<bool,_bool> extdir_lohi_x;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box *domain_box;
  int ncomp;
  Real dtdx;
  Real dx;
  undefined8 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  undefined1 local_5d0 [16];
  anon_class_680_18_15492e0f *in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa4c;
  Box *in_stack_fffffffffffffa50;
  undefined1 auStack_590 [64];
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  undefined1 auStack_538 [64];
  undefined1 auStack_4f8 [64];
  double local_4b8;
  undefined8 local_4b0;
  undefined1 auStack_4a8 [64];
  undefined1 auStack_468 [64];
  undefined1 auStack_428 [64];
  undefined1 auStack_3e8 [64];
  undefined1 auStack_3a8 [64];
  undefined1 auStack_368 [64];
  undefined1 local_328 [64];
  undefined1 auStack_2e8 [64];
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  undefined1 auStack_290 [64];
  undefined1 auStack_250 [64];
  double local_210;
  undefined8 local_208;
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined1 auStack_180 [64];
  undefined1 auStack_140 [64];
  undefined1 auStack_100 [64];
  undefined1 auStack_c0 [68];
  byte local_7c;
  byte local_7b;
  pair<bool,_bool> local_7a;
  int local_78;
  int local_74;
  byte local_70;
  byte local_6f;
  byte local_6e;
  byte local_6d;
  pair<bool,_bool> local_6c;
  pair<bool,_bool> local_6a;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Box *local_58;
  undefined4 local_4c;
  double local_48;
  Real local_40;
  double local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  void *local_10;
  Box *local_8;
  
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = amrex::CoordSys::CellSize(&in_stack_00000030->super_CoordSys,0);
  local_48 = local_38 / local_40;
  local_4c = 3;
  local_58 = amrex::Geometry::Domain(in_stack_00000030);
  local_5c = amrex::Box::smallEnd(local_58,0);
  local_60 = amrex::Box::bigEnd(local_58,0);
  local_64 = amrex::Box::smallEnd(local_58,1);
  local_68 = amrex::Box::bigEnd(local_58,1);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xab2ece);
  local_6a = anon_unknown.dwarf_6175fa::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                        (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                        (int)in_stack_fffffffffffffa08);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xab2ef2);
  local_6c = anon_unknown.dwarf_6175fa::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                        (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                        (int)in_stack_fffffffffffffa08);
  local_6d = local_6a.first & 1;
  local_6e = local_6a.second & 1;
  local_6f = local_6c.first & 1;
  local_70 = local_6c.second & 1;
  local_74 = amrex::Box::smallEnd(local_58,2);
  local_78 = amrex::Box::bigEnd(local_58,2);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xab2f8b);
  local_7a = anon_unknown.dwarf_6175fa::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                        (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                        (int)in_stack_fffffffffffffa08);
  iVar1 = local_5c;
  local_7b = local_7a.first & 1;
  local_7c = local_7a.second & 1;
  if ((local_6d & 1) == 0) {
LAB_00ab2ffa:
    iVar1 = local_60;
    if ((local_6e & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,0);
      if (iVar1 <= iVar2) goto LAB_00ab3102;
    }
    iVar1 = local_74;
    if ((local_7b & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,2);
      if (iVar2 + -1 <= iVar1) goto LAB_00ab3102;
    }
    iVar1 = local_78;
    if ((local_7c & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,2);
      if (iVar1 <= iVar2) goto LAB_00ab3102;
    }
    iVar1 = local_64;
    if ((local_6f & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,1);
      if (iVar2 + -1 <= iVar1) goto LAB_00ab3102;
    }
    iVar1 = local_68;
    if ((local_70 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,1);
      if (iVar1 <= iVar2) goto LAB_00ab3102;
    }
    memcpy(local_5d0,local_20,0x3c);
    memcpy(auStack_590,local_28,0x3c);
    local_550 = local_5c;
    local_54c = local_64;
    local_548 = local_74;
    local_544 = local_60;
    local_540 = local_68;
    local_53c = local_78;
    memcpy(auStack_538,local_10,0x3c);
    memcpy(auStack_4f8,local_18,0x3c);
    local_4b8 = local_48;
    local_4b0 = in_stack_00000040;
    memcpy(auStack_4a8,local_30,0x3c);
    memcpy(auStack_468,in_stack_00000028,0x3c);
    memcpy(auStack_428,in_stack_00000008,0x3c);
    memcpy(auStack_3e8,in_stack_00000010,0x3c);
    memcpy(auStack_3a8,in_stack_00000018,0x3c);
    memcpy(auStack_368,in_stack_00000020,0x3c);
    amrex::
    ParallelFor<int,EBPLM::PredictVelOnXFace(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__1,void>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,in_stack_fffffffffffffa40);
  }
  else {
    iVar2 = amrex::Box::smallEnd(local_8,0);
    if (iVar1 < iVar2 + -1) goto LAB_00ab2ffa;
LAB_00ab3102:
    memcpy(local_328,local_20,0x3c);
    memcpy(auStack_2e8,local_28,0x3c);
    local_2a8 = local_5c;
    local_2a4 = local_64;
    local_2a0 = local_74;
    local_29c = local_60;
    local_298 = local_68;
    local_294 = local_78;
    memcpy(auStack_290,local_10,0x3c);
    memcpy(auStack_250,local_18,0x3c);
    local_210 = local_48;
    local_208 = in_stack_00000040;
    memcpy(auStack_200,local_30,0x3c);
    memcpy(auStack_1c0,in_stack_00000028,0x3c);
    memcpy(auStack_180,in_stack_00000008,0x3c);
    memcpy(auStack_140,in_stack_00000010,0x3c);
    memcpy(auStack_100,in_stack_00000018,0x3c);
    memcpy(auStack_c0,in_stack_00000020,0x3c);
    amrex::
    ParallelFor<int,EBPLM::PredictVelOnXFace(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__0,void>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,in_stack_fffffffffffffa40);
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnXFace (Box const& xebox,
                          Array4<Real> const& Imx, Array4<Real> const& Ipx,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= xebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= xebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= xebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= xebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= xebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= xebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                 Real delta_y =  yf  - ccc(i,j,k,1);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                 Real delta_y = yf  - ccc(i-1,j,k,1);,
                                 Real delta_z = zf  - ccc(i-1,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                Real delta_y = yf  - ccc(i-1,j,k,1);,
                                Real delta_z = zf  - ccc(i-1,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
}